

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::reverse_vertical(Image *this)

{
  ssize_t y;
  ulong y_00;
  ssize_t x;
  long x_00;
  uint64_t a2;
  uint64_t b2;
  uint64_t g2;
  uint64_t r2;
  uint64_t a1;
  uint64_t b1;
  uint64_t g1;
  uint64_t r1;
  
  for (y_00 = 0; (long)y_00 < this->height / 2; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < this->width; x_00 = x_00 + 1) {
      read_pixel(this,x_00,y_00,&r1,&g1,&b1,&a1);
      read_pixel(this,x_00,this->height + ~y_00,&r2,&g2,&b2,&a2);
      write_pixel(this,x_00,this->height + ~y_00,r1,g1,b1,a1);
      write_pixel(this,x_00,y_00,r2,g2,b2,a2);
    }
  }
  return;
}

Assistant:

void Image::reverse_vertical() {
  for (ssize_t y = 0; y < this->height / 2; y++) {
    for (ssize_t x = 0; x < this->width; x++) {
      uint64_t r1, g1, b1, a1, r2, g2, b2, a2;
      this->read_pixel(x, y, &r1, &g1, &b1, &a1);
      this->read_pixel(x, this->height - y - 1, &r2, &g2, &b2, &a2);
      this->write_pixel(x, this->height - y - 1, r1, g1, b1, a1);
      this->write_pixel(x, y, r2, g2, b2, a2);
    }
  }
}